

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_Error cff_get_is_cid(CFF_Face face,FT_Bool *is_cid)

{
  void *pvVar1;
  CFF_FontRecDict dict;
  CFF_Font_conflict cff;
  FT_Error error;
  FT_Bool *is_cid_local;
  CFF_Face face_local;
  
  pvVar1 = (face->extra).data;
  *is_cid = '\0';
  if ((pvVar1 != (void *)0x0) && (*(int *)((long)pvVar1 + 0x74c) != 0xffff)) {
    *is_cid = '\x01';
  }
  return 0;
}

Assistant:

static FT_Error
  cff_get_is_cid( CFF_Face  face,
                  FT_Bool  *is_cid )
  {
    FT_Error  error = FT_Err_Ok;
    CFF_Font  cff   = (CFF_Font)face->extra.data;


    *is_cid = 0;

    if ( cff )
    {
      CFF_FontRecDict  dict = &cff->top_font.font_dict;


      if ( dict->cid_registry != 0xFFFFU )
        *is_cid = 1;
    }

    return error;
  }